

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::fresnel::unpolarized::eval(unpolarized *this,float_t zd)

{
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar1;
  long in_RSI;
  int i;
  long lVar2;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  value_type vVar10;
  float_t c;
  
  if ((0.0 <= zd) && (zd <= 1.0)) {
    std::valarray<float>::valarray((valarray<float> *)this,*(size_t *)(in_RSI + 8));
    pfVar1 = extraout_RDX;
    for (lVar2 = 0; lVar2 < *(int *)(in_RSI + 8); lVar2 = lVar2 + 1) {
      fVar3 = *(float *)(*(long *)(in_RSI + 0x10) + lVar2 * 4);
      fVar3 = fVar3 * fVar3 + zd * zd + -1.0;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
        pfVar1 = extraout_RDX_00;
        fVar6 = extraout_XMM0_Db;
      }
      else {
        fVar3 = SQRT(fVar3);
        fVar6 = 0.0;
      }
      fVar7 = fVar3 + zd;
      fVar8 = zd * fVar7 + -1.0;
      fVar3 = fVar3 - zd;
      fVar9 = zd * fVar3 + 1.0;
      auVar4._0_4_ = fVar3 * fVar3;
      auVar4._4_4_ = fVar8 * fVar8;
      auVar4._8_4_ = fVar6 * fVar6;
      auVar4._12_4_ = 0;
      auVar5._4_4_ = fVar9 * fVar9;
      auVar5._0_4_ = fVar7 * fVar7;
      auVar5._8_4_ = fVar6 * fVar6;
      auVar5._12_4_ = 0;
      auVar5 = divps(auVar4,auVar5);
      *(float *)((this->ior)._M_size + lVar2 * 4) = (auVar5._4_4_ + 1.0) * auVar5._0_4_ * 0.5;
    }
    vVar10._M_data = pfVar1;
    vVar10._M_size = (size_t)this;
    return vVar10;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x474,"virtual brdf::value_type djb::fresnel::unpolarized::eval(float_t) const");
}

Assistant:

brdf::value_type unpolarized::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	brdf::value_type F(ior.size());

	for (int i = 0; i < (int)ior.size(); ++i)
		F[i] = unpolarized__eval(zd, ior[i]);

	return F;
}